

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O0

void __thiscall fasttext::Autotune::printInfo(Autotune *this,double maxDuration)

{
  double *pdVar1;
  ostream *poVar2;
  long in_RDI;
  double in_XMM0_Qa;
  double progress;
  ClockPrint *me;
  ClockPrint local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  double local_20;
  double local_18;
  double local_10;
  
  local_18 = (*(double *)(in_RDI + 0x10) * 100.0) / in_XMM0_Qa;
  local_20 = 100.0;
  local_10 = in_XMM0_Qa;
  pdVar1 = std::min<double>(&local_18,&local_20);
  local_18 = *pdVar1;
  std::operator<<((ostream *)&std::cerr,"\r");
  std::ostream::operator<<(&std::cerr,std::fixed);
  std::operator<<((ostream *)&std::cerr,"Progress: ");
  local_24 = (int)std::setprecision(1);
  poVar2 = std::operator<<((ostream *)&std::cerr,(_Setprecision)local_24);
  local_28 = (int)std::setw(5);
  poVar2 = std::operator<<(poVar2,(_Setw)local_28);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
  std::operator<<(poVar2,"%");
  poVar2 = std::operator<<((ostream *)&std::cerr," Trials: ");
  local_2c = (int)std::setw(4);
  poVar2 = std::operator<<(poVar2,(_Setw)local_2c);
  std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x20));
  poVar2 = std::operator<<((ostream *)&std::cerr," Best score: ");
  local_30 = (int)std::setw(9);
  poVar2 = std::operator<<(poVar2,(_Setw)local_30);
  local_34 = (int)std::setprecision(6);
  std::operator<<(poVar2,(_Setprecision)local_34);
  if ((*(double *)(in_RDI + 0x18) != -1.0) || (NAN(*(double *)(in_RDI + 0x18)))) {
    std::ostream::operator<<(&std::cerr,*(double *)(in_RDI + 0x18));
  }
  else {
    std::operator<<((ostream *)&std::cerr,"unknown");
  }
  std::operator<<((ostream *)&std::cerr," ETA: ");
  poVar2 = (ostream *)(local_10 - *(double *)(in_RDI + 0x10));
  me = (ClockPrint *)0x0;
  pdVar1 = std::max<double>((double *)&stack0xffffffffffffffc0,(double *)&stack0xffffffffffffffb8);
  utils::ClockPrint::ClockPrint(&local_38,(int)*pdVar1);
  utils::operator<<(poVar2,me);
  std::ostream::operator<<(&std::cerr,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void Autotune::printInfo(double maxDuration) {
  double progress = elapsed_ * 100 / maxDuration;
  progress = std::min(progress, 100.0);

  std::cerr << "\r";
  std::cerr << std::fixed;
  std::cerr << "Progress: ";
  std::cerr << std::setprecision(1) << std::setw(5) << progress << "%";
  std::cerr << " Trials: " << std::setw(4) << trials_;
  std::cerr << " Best score: " << std::setw(9) << std::setprecision(6);
  if (bestScore_ == kUnknownBestScore) {
    std::cerr << "unknown";
  } else {
    std::cerr << bestScore_;
  }
  std::cerr << " ETA: "
            << utils::ClockPrint(std::max(maxDuration - elapsed_, 0.0));
  std::cerr << std::flush;
}